

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeGetRequestedReserve(Btree *p)

{
  int *piVar1;
  byte bVar2;
  u32 uVar3;
  u32 uVar4;
  BtShared *pBVar5;
  uint uVar6;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBVar5 = p->pBt;
  bVar2 = pBVar5->nReserveWanted;
  uVar3 = pBVar5->pageSize;
  uVar4 = pBVar5->usableSize;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  uVar6 = uVar3 - uVar4;
  if ((int)uVar6 <= (int)(uint)bVar2) {
    uVar6 = (uint)bVar2;
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetRequestedReserve(Btree *p){
  int n1, n2;
  sqlite3BtreeEnter(p);
  n1 = (int)p->pBt->nReserveWanted;
  n2 = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  return n1>n2 ? n1 : n2;
}